

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HMMSegment.hpp
# Opt level: O0

const_iterator __thiscall
cppjieba::HMMSegment::SequentialLetterRule(HMMSegment *this,const_iterator begin,const_iterator end)

{
  uint uVar1;
  Rune x;
  const_iterator end_local;
  const_iterator begin_local;
  HMMSegment *this_local;
  const_iterator local_8;
  
  uVar1 = begin->rune;
  if (((0x60 < uVar1) && (uVar1 < 0x7b)) || ((local_8 = begin, 0x40 < uVar1 && (uVar1 < 0x5b)))) {
    for (begin_local = begin + 1;
        (begin_local != end &&
        (((uVar1 = begin_local->rune, 0x60 < uVar1 && (uVar1 < 0x7b)) ||
         (((0x40 < uVar1 && (uVar1 < 0x5b)) || ((0x2f < uVar1 && (uVar1 < 0x3a))))))));
        begin_local = begin_local + 1) {
    }
    local_8 = begin_local;
  }
  return local_8;
}

Assistant:

RuneStrArray::const_iterator SequentialLetterRule(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end) const {
    Rune x = begin->rune;
    if (('a' <= x && x <= 'z') || ('A' <= x && x <= 'Z')) {
      begin ++;
    } else {
      return begin;
    }
    while (begin != end) {
      x = begin->rune;
      if (('a' <= x && x <= 'z') || ('A' <= x && x <= 'Z') || ('0' <= x && x <= '9')) {
        begin ++;
      } else {
        break;
      }
    }
    return begin;
  }